

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O3

void __thiscall
singleParticleSpectra::calculate_Qn_vector
          (singleParticleSpectra *this,int event_id,double pT_min_selected,double pT_max_selected,
          vector<double,_std::allocator<double>_> *event_pT_mean,
          vector<double,_std::allocator<double>_> *event_pT_mean_err,
          vector<double,_std::allocator<double>_> *event_Qn_real,
          vector<double,_std::allocator<double>_> *event_Qn_real_err,
          vector<double,_std::allocator<double>_> *event_Qn_imag,
          vector<double,_std::allocator<double>_> *event_Qn_imag_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag_err)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer pvVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  vector<particle_info,_std::allocator<particle_info>_> *pvVar12;
  double *pdVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  uVar14 = this->npT;
  if (0 < (int)uVar14) {
    pdVar1 = (event_pT_mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (event_pT_mean_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar18 = 0;
    do {
      pdVar1[uVar18] = 0.0;
      pdVar2[uVar18] = 0.0;
      uVar18 = uVar18 + 1;
    } while (uVar14 != uVar18);
  }
  iVar15 = this->order_max;
  if (0 < (long)iVar15) {
    pdVar1 = (event_Qn_real->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (event_Qn_real_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (event_Qn_imag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (event_Qn_imag_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar5 = (event_Qn_diff_real->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (event_Qn_diff_real_err->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar7 = (event_Qn_diff_imag->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = (event_Qn_diff_imag_err->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar17 = 0;
    do {
      pdVar1[lVar17] = 0.0;
      pdVar2[lVar17] = 0.0;
      pdVar3[lVar17] = 0.0;
      pdVar4[lVar17] = 0.0;
      if (0 < (int)uVar14) {
        lVar19 = *(long *)&pvVar5[lVar17].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        lVar9 = *(long *)&pvVar6[lVar17].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data;
        lVar10 = *(long *)&pvVar7[lVar17].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        lVar11 = *(long *)&pvVar8[lVar17].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        uVar18 = 0;
        do {
          *(undefined8 *)(lVar19 + uVar18 * 8) = 0;
          *(undefined8 *)(lVar9 + uVar18 * 8) = 0;
          *(undefined8 *)(lVar10 + uVar18 * 8) = 0;
          *(undefined8 *)(lVar11 + uVar18 * 8) = 0;
          uVar18 = uVar18 + 1;
        } while (uVar14 != uVar18);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != iVar15);
  }
  pvVar12 = (((this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->particle_list->
            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_start[event_id];
  uVar14 = (int)((long)*(pointer *)
                        ((long)&pvVar12->
                                super__Vector_base<particle_info,_std::allocator<particle_info>_> +
                        8) -
                 *(long *)&pvVar12->
                           super__Vector_base<particle_info,_std::allocator<particle_info>_> >> 3) *
           -0x11111111;
  if (0 < (int)uVar14) {
    uVar18 = 0;
    do {
      lVar17 = *(long *)&(((this->particle_list).
                           super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          particle_list->
                         super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[event_id]->
                         super__Vector_base<particle_info,_std::allocator<particle_info>_>;
      lVar19 = uVar18 * 0x78;
      dVar22 = *(double *)(lVar17 + 0x28 + lVar19);
      dVar21 = *(double *)(lVar17 + 0x30 + lVar19);
      if (this->rap_type == 0) {
        dVar24 = *(double *)(lVar17 + lVar19 + 8);
        dVar21 = dVar21 * dVar21 - dVar24 * dVar24;
        if (dVar21 < 0.0) {
          dVar21 = sqrt(dVar21);
        }
        else {
          dVar21 = SQRT(dVar21);
        }
      }
      dVar22 = log((dVar22 + dVar21) / (dVar21 - dVar22));
      dVar22 = dVar22 * 0.5;
      if ((this->rap_min <= dVar22 && dVar22 != this->rap_min) && (dVar22 < this->rap_max)) {
        lVar17 = *(long *)&(((this->particle_list).
                             super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                            ->particle_list->
                           super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                           )._M_impl.super__Vector_impl_data._M_start[event_id]->
                           super__Vector_base<particle_info,_std::allocator<particle_info>_>;
        dVar22 = *(double *)(lVar17 + 0x18 + lVar19);
        dVar21 = *(double *)(lVar17 + 0x20 + lVar19);
        dVar24 = SQRT(dVar22 * dVar22 + dVar21 * dVar21);
        dVar22 = atan2(dVar21,dVar22);
        if ((pT_min_selected < dVar24) && (dVar24 < pT_max_selected)) {
          pdVar13 = (event_Qn_real->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          *pdVar13 = *pdVar13 + 1.0;
          pdVar13 = (event_Qn_real_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                    .super__Vector_impl_data._M_start;
          *pdVar13 = *pdVar13 + 1.0;
          pdVar13 = (event_Qn_imag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          *pdVar13 = *pdVar13 + dVar24;
          pdVar13 = (event_Qn_imag_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                    .super__Vector_impl_data._M_start;
          *pdVar13 = *pdVar13 + dVar24 * dVar24;
          iVar15 = this->order_max;
          if (1 < iVar15) {
            lVar17 = 1;
            do {
              dVar21 = (double)(int)lVar17 * dVar22;
              dVar23 = cos(dVar21);
              dVar21 = sin(dVar21);
              pdVar1 = (event_Qn_real->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar1[lVar17] = pdVar1[lVar17] + dVar23;
              pdVar1 = (event_Qn_imag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar1[lVar17] = pdVar1[lVar17] + dVar21;
              pdVar1 = (event_Qn_real_err->super__Vector_base<double,_std::allocator<double>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              pdVar1[lVar17] = dVar23 * dVar23 + pdVar1[lVar17];
              pdVar1 = (event_Qn_imag_err->super__Vector_base<double,_std::allocator<double>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              pdVar1[lVar17] = dVar21 * dVar21 + pdVar1[lVar17];
              lVar17 = lVar17 + 1;
              iVar15 = this->order_max;
            } while (lVar17 < iVar15);
          }
          if (((this->pT_min <= dVar24) &&
              (uVar16 = (uint)((dVar24 - this->pT_min) / this->dpT), -1 < (int)uVar16)) &&
             ((int)uVar16 < this->npT)) {
            uVar20 = (ulong)uVar16;
            pdVar1 = (event_pT_mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar1[uVar20] = dVar24 + pdVar1[uVar20];
            pdVar1 = (event_pT_mean_err->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar1[uVar20] = dVar24 * dVar24 + pdVar1[uVar20];
            if (0 < iVar15) {
              lVar19 = 0;
              lVar17 = 0;
              do {
                dVar21 = (double)(int)lVar17 * dVar22;
                dVar24 = cos(dVar21);
                dVar21 = sin(dVar21);
                lVar9 = *(long *)((long)&(((event_Qn_diff_real->
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data + lVar19);
                *(double *)(lVar9 + uVar20 * 8) = *(double *)(lVar9 + uVar20 * 8) + dVar24;
                lVar9 = *(long *)((long)&(((event_Qn_diff_real_err->
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data + lVar19);
                *(double *)(lVar9 + uVar20 * 8) = dVar24 * dVar24 + *(double *)(lVar9 + uVar20 * 8);
                lVar9 = *(long *)((long)&(((event_Qn_diff_imag->
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data + lVar19);
                *(double *)(lVar9 + uVar20 * 8) = *(double *)(lVar9 + uVar20 * 8) + dVar21;
                lVar9 = *(long *)((long)&(((event_Qn_diff_imag_err->
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data + lVar19);
                *(double *)(lVar9 + uVar20 * 8) = dVar21 * dVar21 + *(double *)(lVar9 + uVar20 * 8);
                lVar17 = lVar17 + 1;
                lVar19 = lVar19 + 0x18;
              } while (lVar17 < this->order_max);
            }
          }
        }
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != (uVar14 & 0x7fffffff));
  }
  return;
}

Assistant:

void singleParticleSpectra::calculate_Qn_vector(
    int event_id, double pT_min_selected, double pT_max_selected,
    vector<double> &event_pT_mean, vector<double> &event_pT_mean_err,
    vector<double> &event_Qn_real, vector<double> &event_Qn_real_err,
    vector<double> &event_Qn_imag, vector<double> &event_Qn_imag_err,
    vector<vector<double>> &event_Qn_diff_real,
    vector<vector<double>> &event_Qn_diff_real_err,
    vector<vector<double>> &event_Qn_diff_imag,
    vector<vector<double>> &event_Qn_diff_imag_err) {
    // first clean the results arrays
    for (int i = 0; i < npT; i++) {
        event_pT_mean[i] = 0.0;
        event_pT_mean_err[i] = 0.0;
    }
    for (int i = 0; i < order_max; i++) {
        event_Qn_real[i] = 0.0;
        event_Qn_real_err[i] = 0.0;
        event_Qn_imag[i] = 0.0;
        event_Qn_imag_err[i] = 0.0;
        for (int j = 0; j < npT; j++) {
            event_Qn_diff_real[i][j] = 0.0;
            event_Qn_diff_real_err[i][j] = 0.0;
            event_Qn_diff_imag[i][j] = 0.0;
            event_Qn_diff_imag_err[i][j] = 0.0;
        }
    }

    int number_of_particles = particle_list->get_number_of_particles(event_id);
    for (int i = 0; i < number_of_particles; i++) {
        double pz_local = particle_list->get_particle(event_id, i).pz;
        double E_local = particle_list->get_particle(event_id, i).E;
        double mass = particle_list->get_particle(event_id, i).mass;

        double rap_local;
        if (rap_type == 0) {
            double pmag = sqrt(E_local * E_local - mass * mass);
            rap_local = 0.5 * log((pmag + pz_local) / (pmag - pz_local));
        } else {
            rap_local = 0.5 * log((E_local + pz_local) / (E_local - pz_local));
        }

        if (rap_local > rap_min && rap_local < rap_max) {
            double px_local = particle_list->get_particle(event_id, i).px;
            double py_local = particle_list->get_particle(event_id, i).py;
            double p_perp = sqrt(px_local * px_local + py_local * py_local);
            double p_phi = atan2(py_local, px_local);
            if (p_perp > pT_min_selected && p_perp < pT_max_selected) {
                event_Qn_real[0] += 1;
                event_Qn_real_err[0] += 1;
                event_Qn_imag[0] += p_perp;
                event_Qn_imag_err[0] += p_perp * p_perp;
                for (int iorder = 1; iorder < order_max; iorder++) {
                    double cos_nphi = cos(iorder * p_phi);
                    double sin_nphi = sin(iorder * p_phi);
                    event_Qn_real[iorder] += cos_nphi;
                    event_Qn_imag[iorder] += sin_nphi;
                    event_Qn_real_err[iorder] += cos_nphi * cos_nphi;
                    event_Qn_imag_err[iorder] += sin_nphi * sin_nphi;
                }

                if (p_perp < pT_min) continue;

                int p_idx = static_cast<int>((p_perp - pT_min) / dpT);
                if (p_idx < 0 || p_idx >= npT) continue;

                event_pT_mean[p_idx] += p_perp;
                event_pT_mean_err[p_idx] += p_perp * p_perp;
                for (int iorder = 0; iorder < order_max; iorder++) {
                    double cos_nphi = cos(iorder * p_phi);
                    double sin_nphi = sin(iorder * p_phi);
                    event_Qn_diff_real[iorder][p_idx] += cos_nphi;
                    event_Qn_diff_real_err[iorder][p_idx] +=
                        cos_nphi * cos_nphi;
                    event_Qn_diff_imag[iorder][p_idx] += sin_nphi;
                    event_Qn_diff_imag_err[iorder][p_idx] +=
                        sin_nphi * sin_nphi;
                }
            }
        }
    }
}